

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadStream.cpp
# Opt level: O2

void __thiscall ReadStream::ReadStream(ReadStream *this,string *filePath)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  
  std::ifstream::ifstream(this);
  this->fileIsOpen = false;
  this->size = 0;
  std::ifstream::open((string *)this,(_Ios_Openmode)filePath);
  std::istream::seekg((long)this,_S_beg);
  iVar2 = std::istream::tellg();
  this->size = iVar2 << 4;
  std::istream::seekg((long)this,_S_beg);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"Shortcut or Jump List file is not opened. ");
    poVar3 = std::operator<<(poVar3,
                             "Please check that you input correct path and start program again.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    this->fileIsOpen = true;
  }
  return;
}

Assistant:

ReadStream::ReadStream(std::string filePath) {
        f.open(filePath, std::ios::binary);
        f.seekg (0, std::ios::end);
        size = f.tellg() * 16;
        f.seekg (0, std::ios::beg);
        if(!f.is_open())
            cout << "Shortcut or Jump List file is not opened. "
                 << "Please check that you input correct path and start program again." << endl;
        else
            fileIsOpen = true;
    }